

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zesOverclockGetControlCurrentValue
          (zes_overclock_handle_t hDomainHandle,zes_overclock_control_t DomainControl,double *pValue
          )

{
  zes_pfnOverclockGetControlCurrentValue_t pfnGetControlCurrentValue;
  ze_result_t result;
  double *pValue_local;
  zes_overclock_control_t DomainControl_local;
  zes_overclock_handle_t hDomainHandle_local;
  
  pfnGetControlCurrentValue._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011cb48 != (code *)0x0) {
    pfnGetControlCurrentValue._4_4_ = (*DAT_0011cb48)(hDomainHandle,DomainControl,pValue);
  }
  return pfnGetControlCurrentValue._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesOverclockGetControlCurrentValue(
        zes_overclock_handle_t hDomainHandle,           ///< [in] Handle for the component.
        zes_overclock_control_t DomainControl,          ///< [in] Overclock Control.
        double* pValue                                  ///< [in,out] Getting overclock control value for the specified control.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetControlCurrentValue = context.zesDdiTable.Overclock.pfnGetControlCurrentValue;
        if( nullptr != pfnGetControlCurrentValue )
        {
            result = pfnGetControlCurrentValue( hDomainHandle, DomainControl, pValue );
        }
        else
        {
            // generic implementation
        }

        return result;
    }